

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

void __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp:174:37)>
::move(impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_function_object_cpp:174:37)>
       *this,model *to)

{
  gc_heap *pgVar1;
  
  to->_vptr_model = (_func_int **)&PTR_destroy_001d8ab8;
  pgVar1 = (this->f).f.super_gc_heap_ptr_untyped.heap_;
  to[1]._vptr_model = (_func_int **)pgVar1;
  *(uint32_t *)&to[2]._vptr_model = (this->f).f.super_gc_heap_ptr_untyped.pos_;
  if (pgVar1 != (gc_heap *)0x0) {
    gc_heap::attach(pgVar1,(gc_heap_ptr_untyped *)(to + 1));
  }
  pgVar1 = (this->f).bound_args.super_gc_heap_ptr_untyped.heap_;
  to[3]._vptr_model = (_func_int **)pgVar1;
  *(uint32_t *)&to[4]._vptr_model = (this->f).bound_args.super_gc_heap_ptr_untyped.pos_;
  if (pgVar1 != (gc_heap *)0x0) {
    gc_heap::attach(pgVar1,(gc_heap_ptr_untyped *)(to + 3));
  }
  return;
}

Assistant:

void move(model* to) override { new (to) impl<F>(std::move(*this)); }